

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderLocatorLineNumber(xmlTextReaderLocatorPtr locator)

{
  int iVar1;
  long lVar2;
  xmlParserCtxtPtr ctx;
  
  iVar1 = -1;
  if (locator != (xmlTextReaderLocatorPtr)0x0) {
    if (*(xmlNode **)((long)locator + 0x50) == (xmlNode *)0x0) {
      lVar2 = *(long *)((long)locator + 0x38);
      if ((*(long *)(lVar2 + 8) == 0) && (1 < (long)*(int *)((long)locator + 0x40))) {
        lVar2 = *(long *)(*(long *)((long)locator + 0x48) + -0x10 +
                         (long)*(int *)((long)locator + 0x40) * 8);
      }
      if (lVar2 != 0) {
        return *(int *)(lVar2 + 0x34);
      }
    }
    else {
      lVar2 = xmlGetLineNo(*(xmlNode **)((long)locator + 0x50));
      iVar1 = (int)lVar2;
    }
  }
  return iVar1;
}

Assistant:

int
xmlTextReaderLocatorLineNumber(xmlTextReaderLocatorPtr locator) {
    /* we know that locator is a xmlParserCtxtPtr */
    xmlParserCtxtPtr ctx = (xmlParserCtxtPtr)locator;
    int ret = -1;

    if (locator == NULL)
        return(-1);
    if (ctx->node != NULL) {
	ret = xmlGetLineNo(ctx->node);
    }
    else {
	/* inspired from error.c */
	xmlParserInputPtr input;
	input = ctx->input;
	if ((input->filename == NULL) && (ctx->inputNr > 1))
	    input = ctx->inputTab[ctx->inputNr - 2];
	if (input != NULL) {
	    ret = input->line;
	}
	else {
	    ret = -1;
	}
    }

    return ret;
}